

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng_ext.c
# Opt level: O3

light_pcapng_file_info *
light_create_file_info(char *os_desc,char *hardware_desc,char *user_app_desc,char *file_comment)

{
  light_pcapng_file_info *plVar1;
  size_t sVar2;
  char *pcVar3;
  size_t os_len;
  size_t app_len;
  size_t hw_len;
  size_t comment_len;
  
  plVar1 = (light_pcapng_file_info *)calloc(1,400);
  plVar1->major_version = 1;
  if (os_desc != (char *)0x0) {
    sVar2 = strlen(os_desc);
    if (sVar2 != 0) {
      pcVar3 = (char *)calloc(sVar2,1);
      plVar1->os_desc = pcVar3;
      memcpy(pcVar3,os_desc,sVar2);
      plVar1->os_desc_size = sVar2;
    }
  }
  if (hardware_desc != (char *)0x0) {
    sVar2 = strlen(hardware_desc);
    if (sVar2 != 0) {
      pcVar3 = (char *)calloc(sVar2,1);
      plVar1->hardware_desc = pcVar3;
      memcpy(pcVar3,hardware_desc,sVar2);
      plVar1->hardware_desc_size = sVar2;
    }
  }
  if (user_app_desc != (char *)0x0) {
    sVar2 = strlen(user_app_desc);
    if (sVar2 != 0) {
      pcVar3 = (char *)calloc(sVar2,1);
      plVar1->user_app_desc = pcVar3;
      memcpy(pcVar3,user_app_desc,sVar2);
      plVar1->user_app_desc_size = sVar2;
    }
  }
  if (file_comment != (char *)0x0) {
    sVar2 = strlen(file_comment);
    if (sVar2 != 0) {
      pcVar3 = (char *)calloc(sVar2,1);
      plVar1->file_comment = pcVar3;
      memcpy(pcVar3,file_comment,sVar2);
      plVar1->file_comment_size = sVar2;
    }
  }
  return plVar1;
}

Assistant:

light_pcapng_file_info *light_create_file_info(const char *os_desc, const char *hardware_desc, const char *user_app_desc, const char *file_comment)
{
	light_pcapng_file_info *info = light_create_default_file_info();

	if (os_desc != NULL && strlen(os_desc) > 0)
	{
		size_t os_len = strlen(os_desc);
		info->os_desc = calloc(os_len, sizeof(char));
		memcpy(info->os_desc, os_desc, os_len);
		info->os_desc_size = os_len;
	}

	if (hardware_desc != NULL && strlen(hardware_desc) > 0)
	{
		size_t hw_len = strlen(hardware_desc);
		info->hardware_desc = calloc(hw_len, sizeof(char));
		memcpy(info->hardware_desc, hardware_desc, hw_len);
		info->hardware_desc_size = hw_len;
	}

	if (user_app_desc != NULL && strlen(user_app_desc) > 0)
	{
		size_t app_len = strlen(user_app_desc);
		info->user_app_desc = calloc(app_len, sizeof(char));
		memcpy(info->user_app_desc, user_app_desc, app_len);
		info->user_app_desc_size = app_len;
	}

	if (file_comment != NULL && strlen(file_comment) > 0)
	{
		size_t comment_len = strlen(file_comment);
		info->file_comment = calloc(comment_len, sizeof(char));
		memcpy(info->file_comment, file_comment, comment_len);
		info->file_comment_size = comment_len;
	}

	return info;
}